

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O2

void flatcc_json_printer_struct_as_nested_root
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len,char *fid,flatcc_json_printer_struct_f *pf)

{
  int iVar1;
  char *pcVar2;
  uint *puVar3;
  uint *buf;
  
  puVar3 = (uint *)get_field_ptr(td,id);
  if (puVar3 != (uint *)0x0) {
    buf = (uint *)((long)puVar3 + (ulong)*puVar3);
    accept_header(ctx,buf,(ulong)*(uint *)((ulong)*puVar3 + (long)puVar3),fid);
    iVar1 = td->count;
    td->count = iVar1 + 1;
    if (iVar1 != 0) {
      pcVar2 = ctx->p;
      ctx->p = pcVar2 + 1;
      *pcVar2 = ',';
    }
    print_name(ctx,name,len);
    ctx->level = ctx->level + 1;
    pcVar2 = ctx->p;
    ctx->p = pcVar2 + 1;
    *pcVar2 = '{';
    (*pf)(ctx,(void *)((ulong)*buf + (long)buf));
    if (ctx->indent != '\0') {
      pcVar2 = ctx->p;
      ctx->p = pcVar2 + 1;
      *pcVar2 = '\n';
      ctx->level = ctx->level + -1;
      print_indent(ctx);
    }
    pcVar2 = ctx->p;
    ctx->p = pcVar2 + 1;
    *pcVar2 = '}';
  }
  return;
}

Assistant:

void flatcc_json_printer_struct_as_nested_root(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len,
        const char *fid,
        flatcc_json_printer_struct_f *pf)
{
    const uoffset_t *buf;
    uoffset_t bufsiz;

    if (0 == (buf = get_field_ptr(td, id))) {
        return;
    }
    buf = (const uoffset_t *)((size_t)buf + __flatbuffers_uoffset_read_from_pe(buf));
    bufsiz = __flatbuffers_uoffset_read_from_pe(buf);
    if (!accept_header(ctx, buf, bufsiz, fid)) {
        return;
    }
    if (td->count++) {
        print_char(',');
    }
    print_name(ctx, name, len);
    print_start('{');
    pf(ctx, read_uoffset_ptr(buf));
    print_end('}');
}